

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::unpack_expression_type
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr_str,SPIRType *param_2,
          uint32_t param_3,bool param_4,bool param_5)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr_str);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::unpack_expression_type(string expr_str, const SPIRType &, uint32_t, bool, bool)
{
	return expr_str;
}